

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msocket.c
# Opt level: O0

int8_t msocket_startIoThread(msocket_t *self)

{
  int iVar1;
  int *piVar2;
  int rc;
  msocket_t *self_local;
  
  if (((self == (msocket_t *)0x0) || (self->handlerTable == (msocket_handler_t *)0x0)) ||
     (self->threadRunning != '\0')) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    self_local._7_1_ = -1;
  }
  else {
    iVar1 = pthread_create(&self->ioThread,(pthread_attr_t *)0x0,ioTask,self);
    if (iVar1 == 0) {
      self->threadRunning = '\x01';
      self_local._7_1_ = '\0';
    }
    else {
      self_local._7_1_ = -1;
    }
  }
  return self_local._7_1_;
}

Assistant:

static int8_t msocket_startIoThread(msocket_t *self){
   if( (self != 0) && (self->handlerTable != 0) && (self->threadRunning == 0) ){
#ifdef _WIN32
      THREAD_CREATE(self->ioThread,ioTask,self,self->ioThreadId);
      if(self->ioThread == INVALID_HANDLE_VALUE){
         return -1;
      }
#else
      int rc = THREAD_CREATE(self->ioThread,ioTask,self);
      if(rc != 0){
         return -1;
      }
#endif
      self->threadRunning = 1;
      return 0;
   }
   errno = EINVAL;
   return -1;
}